

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

lzham_compress_state_ptr lzham::lzham_lib_compress_reinit(lzham_compress_state_ptr p)

{
  bool bVar1;
  
  if ((p != (lzham_compress_state_ptr)0x0) &&
     (bVar1 = lzcompressor::reset((lzcompressor *)((long)p + 0xa58)), bVar1)) {
    *(undefined4 *)((long)p + 0xc0f6b8) = 0;
    *(undefined8 *)((long)p + 0xc0f650) = 0;
    *(undefined8 *)((long)p + 0xc0f658) = 0;
    *(undefined8 *)((long)p + 0xc0f660) = 0;
    *(undefined8 *)((long)p + 0xc0f668) = 0;
    *(undefined8 *)((long)p + 0xc0f669) = 0;
    *(undefined8 *)((long)p + 0xc0f671) = 0;
    return p;
  }
  return (lzham_compress_state_ptr)0x0;
}

Assistant:

lzham_compress_state_ptr LZHAM_CDECL lzham_lib_compress_reinit(lzham_compress_state_ptr p)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state*>(p);
      if (pState)
      {
         if (!pState->m_compressor.reset())
         {
            LZHAM_LOG_ERROR(6010);
            return NULL;
         }

         pState->m_pIn_buf = NULL;
         pState->m_pIn_buf_size = NULL;
         pState->m_pOut_buf = NULL;
         pState->m_pOut_buf_size = NULL;
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
         pState->m_comp_data_ofs = 0;
         pState->m_finished_compression = false;
      }

      return pState;
   }